

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorGraph.hpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkValidatorGraph::insertNode(NeuralNetworkValidatorGraph *this,LayerNode *node)

{
  pointer *pppLVar1;
  pointer pbVar2;
  iterator iVar3;
  LayerNode *pLVar4;
  iterator iVar5;
  mapped_type *ppLVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer pbVar7;
  LayerNode *producingNode;
  LayerNode *local_40;
  LayerNode *local_38;
  
  pbVar7 = (node->inputNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (node->inputNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = node;
  if (pbVar7 != pbVar2) {
    do {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
              ::find(&(this->blobNameToProducingNode)._M_t,pbVar7);
      if ((_Rb_tree_header *)iVar5._M_node !=
          &(this->blobNameToProducingNode)._M_t._M_impl.super__Rb_tree_header) {
        ppLVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
                  ::at(&this->blobNameToProducingNode,pbVar7);
        local_38 = *ppLVar6;
        iVar3._M_current =
             (local_40->parents).
             super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (local_40->parents).
            super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<CoreML::LayerNode*,std::allocator<CoreML::LayerNode*>>::
          _M_realloc_insert<CoreML::LayerNode*const&>
                    ((vector<CoreML::LayerNode*,std::allocator<CoreML::LayerNode*>> *)local_40,iVar3
                     ,&local_38);
        }
        else {
          *iVar3._M_current = local_38;
          pppLVar1 = &(local_40->parents).
                      super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppLVar1 = *pppLVar1 + 1;
        }
        iVar3._M_current =
             (local_38->children).
             super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (local_38->children).
            super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<CoreML::LayerNode*,std::allocator<CoreML::LayerNode*>>::
          _M_realloc_insert<CoreML::LayerNode*const&>
                    ((vector<CoreML::LayerNode*,std::allocator<CoreML::LayerNode*>> *)
                     &local_38->children,iVar3,&local_40);
        }
        else {
          *iVar3._M_current = local_40;
          pppLVar1 = &(local_38->children).
                      super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppLVar1 = *pppLVar1 + 1;
        }
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar2);
  }
  pbVar7 = (local_40->outputNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (local_40->outputNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != pbVar2) {
    do {
      pLVar4 = local_40;
      ppLVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
                ::operator[](&this->blobNameToProducingNode,pbVar7);
      *ppLVar6 = pLVar4;
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar2);
  }
  pLVar4 = local_40;
  ppLVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
            ::operator[](&this->nodeNameToNode,&local_40->name);
  *ppLVar6 = pLVar4;
  return;
}

Assistant:

void insertNode(LayerNode *node)
    {
        for (const auto& name: node->inputNames) {
            if (blobNameToProducingNode.find(name) != blobNameToProducingNode.end()) {
                LayerNode *producingNode = blobNameToProducingNode.at(name);
                node->parents.push_back(producingNode);
                producingNode->children.push_back(node);
            }
        }
        for (const auto& name: node->outputNames) {
            blobNameToProducingNode[name] = node;
        }
        nodeNameToNode[node->name] = node;
    }